

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_GetForcingData
              (MRIStepInnerStepper stepper,sunrealtype *tshift,sunrealtype *tscale,
              N_Vector **forcing,int *nforcing)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x1194,"MRIStepInnerStepper_GetForcingData",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x30);
    *in_RDX = *(undefined8 *)(in_RDI + 0x38);
    *in_RCX = *(undefined8 *)(in_RDI + 0x18);
    *in_R8 = *(undefined4 *)(in_RDI + 0x20);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_GetForcingData(MRIStepInnerStepper stepper,
                                       sunrealtype* tshift, sunrealtype* tscale,
                                       N_Vector** forcing, int* nforcing)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  *tshift   = stepper->tshift;
  *tscale   = stepper->tscale;
  *forcing  = stepper->forcing;
  *nforcing = stepper->nforcing;

  return ARK_SUCCESS;
}